

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O3

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<float,int>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          int *out_value)

{
  bool bVar1;
  float fVar2;
  pointer puVar3;
  pointer puVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  
  uVar7 = *(uint *)&this->num_components_;
  bVar8 = out_num_components;
  if ((byte)uVar7 < out_num_components) {
    bVar8 = (byte)uVar7;
  }
  if (bVar8 != 0) {
    puVar3 = (this->buffer_->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = this->byte_offset_ + (ulong)att_id.value_ * this->byte_stride_;
    puVar4 = (this->buffer_->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar1 = this->normalized_;
    lVar10 = 0;
    uVar9 = 0;
    do {
      if (puVar4 <= puVar3 + lVar10 + uVar5) {
        return false;
      }
      fVar2 = *(float *)(puVar3 + uVar9 * 4 + uVar5);
      if (2.1474836e+09 <= fVar2) {
        return false;
      }
      if (fVar2 < -2.1474836e+09) {
        return false;
      }
      if (0x7f7fffff < (uint)ABS(fVar2)) {
        return false;
      }
      if ((bVar1 & 1U) == 0) {
        iVar6 = (int)fVar2;
      }
      else {
        if (1.0 < fVar2) {
          return false;
        }
        if (fVar2 < 0.0) {
          return false;
        }
        dVar11 = floor((double)fVar2 * 2147483647.0 + 0.5);
        iVar6 = (int)dVar11;
      }
      out_value[uVar9] = iVar6;
      uVar9 = uVar9 + 1;
      uVar7 = *(uint *)&this->num_components_;
      bVar8 = (byte)uVar7;
      if (out_num_components <= (byte)uVar7) {
        bVar8 = out_num_components;
      }
      lVar10 = lVar10 + 4;
    } while (uVar9 < bVar8);
  }
  if ((byte)uVar7 < out_num_components) {
    memset(out_value + (uVar7 & 0xff),0,(ulong)((uint)out_num_components + ~(uVar7 & 0xff)) * 4 + 4)
    ;
  }
  return true;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }